

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O0

TexDictionary * rw::TexDictionary::streamRead(Stream *stream)

{
  FILE *pFVar1;
  bool bVar2;
  int16 iVar3;
  char *pcVar4;
  Error local_44;
  Error _e_1;
  int32 i;
  Texture *tex;
  TexDictionary *txd;
  uint32 local_20;
  int32 numTex;
  Error _e;
  Stream *stream_local;
  
  _e = (Error)stream;
  bVar2 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar2) {
    iVar3 = Stream::readI16((Stream *)_e);
    Stream::readI16((Stream *)_e);
    stream_local = (Stream *)create();
    if ((TexDictionary *)stream_local == (TexDictionary *)0x0) {
      stream_local = (Stream *)0x0;
    }
    else {
      for (_e_1.plugin = 0; (int)_e_1.plugin < (int)iVar3; _e_1.plugin = _e_1.plugin + 1) {
        bVar2 = findChunk((Stream *)_e,0x15,(uint32 *)0x0,(uint32 *)0x0);
        if (!bVar2) {
          local_44.plugin = 0;
          local_44.code = 0x80000004;
          fprintf(_stderr,"%s:%d: ",
                  "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/texture.cpp",
                  0xc4);
          pFVar1 = _stderr;
          pcVar4 = dbgsprint(0x80000004,"TEXTURENATIVE");
          fprintf(pFVar1,"%s\n",pcVar4);
          setError(&local_44);
          goto LAB_00116c68;
        }
        register0x00000000 = Texture::streamReadNative((Stream *)_e);
        if (register0x00000000 == (Texture *)0x0) goto LAB_00116c68;
        PluginList::streamRead((PluginList *)&Texture::s_plglist,(Stream *)_e,register0x00000000);
        add((TexDictionary *)stream_local,stack0xffffffffffffffc8);
      }
      bVar2 = PluginList::streamRead((PluginList *)&s_plglist,(Stream *)_e,stream_local);
      if (!bVar2) {
LAB_00116c68:
        destroy((TexDictionary *)stream_local);
        stream_local = (Stream *)0x0;
      }
    }
  }
  else {
    local_20 = 0;
    numTex = -0x7ffffffc;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/texture.cpp",0xb7);
    pFVar1 = _stderr;
    pcVar4 = dbgsprint(0x80000004,"STRUCT");
    fprintf(pFVar1,"%s\n",pcVar4);
    setError((Error *)&stack0xffffffffffffffe0);
    stream_local = (Stream *)0x0;
  }
  return (TexDictionary *)stream_local;
}

Assistant:

TexDictionary*
TexDictionary::streamRead(Stream *stream)
{
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	int32 numTex = stream->readI16();
	stream->readI16(); // device id (0 = unknown, 1 = d3d8, 2 = d3d9,
	                   // 3 = gcn, 4 = null, 5 = opengl,
	                   // 6 = ps2, 7 = softras, 8 = xbox, 9 = psp)
	TexDictionary *txd = TexDictionary::create();
	if(txd == nil)
		return nil;
	Texture *tex;
	for(int32 i = 0; i < numTex; i++){
		if(!findChunk(stream, ID_TEXTURENATIVE, nil, nil)){
			RWERROR((ERR_CHUNK, "TEXTURENATIVE"));
			goto fail;
		}
		tex = Texture::streamReadNative(stream);
		if(tex == nil)
			goto fail;
		Texture::s_plglist.streamRead(stream, tex);
		txd->add(tex);
	}
	if(s_plglist.streamRead(stream, txd))
		return txd;
fail:
	txd->destroy();
	return nil;
}